

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,bool directoriesSetBefore)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  cmGlobalGenerator *gg;
  ulong uVar8;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse;
  undefined7 in_register_00000011;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  string value;
  string arg;
  string local_d8;
  uint local_b4;
  string local_b0;
  ulong local_90;
  ulong local_88;
  string local_80;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  uVar10 = CONCAT71(in_register_00000011,directoriesSetBefore);
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar11 = 0x20 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4);
  if (bVar11) {
    local_b4 = (uint)uVar10;
    local_60 = (string *)&this->GeneratorToolset;
    local_58 = (string *)&this->GeneratorPlatform;
    local_50 = (string *)&this->GraphVizFile;
    local_48 = (string *)&this->CheckStampList;
    local_40 = (string *)&this->CheckStampFile;
    local_38 = (string *)&this->CheckBuildSystemArgument;
    uVar10 = 1;
    local_88 = 0;
    local_90 = 0;
    do {
      uVar9 = (uint)uVar10;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar1 = pbVar4[uVar10]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + pbVar4[uVar10]._M_string_length);
      lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b907f,0);
      if (lVar5 == 0) {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_b0);
        cmsys::SystemTools::CollapseFullPath(&local_80,&local_d8);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        cmsys::SystemTools::ConvertToUnixSlashes(&local_d8);
        cmState::SetSourceDirectory(this->State,&local_d8);
LAB_002bead0:
        paVar6 = &local_d8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar6) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          paVar6 = extraout_RAX;
        }
        local_b4 = (uint)CONCAT71((int7)((ulong)paVar6 >> 8),1);
LAB_002beaf2:
        bVar2 = true;
      }
      else {
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b636a,0);
        if ((lVar5 == 0) ||
           (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b636d,0), lVar5 == 0))
        goto LAB_002beaf2;
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b9083,0);
        if (lVar5 == 0) {
          std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_b0);
          cmsys::SystemTools::CollapseFullPath(&local_80,&local_d8);
          std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_d8);
          cmState::SetBinaryDirectory(this->State,&local_d8);
          goto LAB_002bead0;
        }
        if ((uVar10 < ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 2U) &&
           (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b6370,0), lVar5 == 0)) {
          std::__cxx11::string::_M_assign(local_38);
          uVar9 = uVar9 + 2;
          iVar3 = atoi((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
          this->ClearBuildSystem = 0 < iVar3;
          goto LAB_002beaf2;
        }
        if ((uVar10 < ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) &&
           (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b6385,0), lVar5 == 0)) {
          uVar9 = uVar9 + 1;
          std::__cxx11::string::_M_assign(local_40);
          goto LAB_002beaf2;
        }
        if ((uVar10 < ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) &&
           (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b6398,0), lVar5 == 0)) {
          uVar9 = uVar9 + 1;
          std::__cxx11::string::_M_assign(local_48);
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b63ab,0);
        if (lVar5 == 0) {
          this->Verbose = true;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4c9d47,0);
        if (((lVar5 == 0) ||
            (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b6246,0), lVar5 == 0)) ||
           (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4ab781,0), lVar5 == 0))
        goto LAB_002beaf2;
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a6147,0);
        if ((lVar5 == 0) ||
           (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a614a,0), lVar5 == 0)) {
          uVar9 = uVar9 + 1;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a645e,0);
        if ((lVar5 == 0) ||
           (lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a6484,0), lVar5 == 0))
        goto LAB_002beaf2;
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b63ae,0);
        if (lVar5 == 0) {
          std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_b0);
          cmsys::SystemTools::CollapseFullPath(&local_80,&local_d8);
          std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_d8);
          std::__cxx11::string::_M_assign(local_50);
          if ((this->GraphVizFile)._M_string_length == 0) {
            cmSystemTools::Error
                      ("No file specified for --graphviz",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a660b,0);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"debug trycompile on\n",0x14);
          this->DebugTryCompile = true;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a6672,0);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with debug output on.\n",0x1e);
          this->DebugOutput = true;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a669c,0);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with trace output on.\n",0x1e);
          this->Trace = true;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a66bd,0);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warn about uninitialized values.\n",0x21);
          this->WarnUninitialized = true;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a66f3,0);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Finding unused variables.\n",0x1a);
          this->WarnUnused = true;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a6723,0);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Not searching for unused variables given on the ",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"command line.\n",0xe);
          this->WarnUnusedCli = false;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4a675f,0);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Also check system files when warning about unused and ",
                     0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"uninitialized variables.\n",0x19);
          this->CheckSystemVars = true;
          goto LAB_002beaf2;
        }
        lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b6516,0);
        if (lVar5 == 0) {
          uVar7 = std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_b0);
          if (local_d8._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
              bVar2 = false;
              cmSystemTools::Error
                        ("No platform specified for -A",(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_002bf013;
            }
            uVar7 = std::__cxx11::string::_M_assign((string *)&local_d8);
          }
          if ((local_88 & 1) == 0) {
            local_88 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
            std::__cxx11::string::_M_assign(local_58);
            bVar2 = true;
          }
          else {
            bVar2 = false;
            cmSystemTools::Error
                      ("Multiple -A options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
          }
LAB_002bf013:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) goto LAB_002beaf2;
        }
        else {
          lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b6552,0);
          if (lVar5 == 0) {
            uVar7 = std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_b0);
            if (local_d8._M_string_length == 0) {
              uVar9 = uVar9 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
                bVar2 = false;
                cmSystemTools::Error
                          ("No toolset specified for -T",(char *)0x0,(char *)0x0,(char *)0x0);
                goto LAB_002bf013;
              }
              uVar7 = std::__cxx11::string::_M_assign((string *)&local_d8);
            }
            if ((local_90 & 1) == 0) {
              local_90 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
              std::__cxx11::string::_M_assign(local_60);
              bVar2 = true;
            }
            else {
              bVar2 = false;
              cmSystemTools::Error
                        ("Multiple -T options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            goto LAB_002bf013;
          }
          lVar5 = std::__cxx11::string::find((char *)&local_b0,0x4b6590,0);
          if (lVar5 != 0) {
            local_b4 = (uint)CONCAT71((int7)((ulong)lVar5 >> 8),1);
            SetDirectoriesFromFile(this,local_b0._M_dataplus._M_p);
            goto LAB_002beaf2;
          }
          std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_b0);
          if (local_d8._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)uVar9 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&local_d8);
              goto LAB_002bef82;
            }
            cmSystemTools::Error
                      ("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
            PrintGeneratorList(this);
            bVar2 = false;
          }
          else {
LAB_002bef82:
            gg = CreateGlobalGenerator(this,&local_d8);
            if (gg == (cmGlobalGenerator *)0x0) {
              cmSystemTools::Error
                        ("Could not create named generator ",local_d8._M_dataplus._M_p,(char *)0x0,
                         (char *)0x0);
              bVar2 = true;
              PrintGeneratorList(this);
            }
            else {
              bVar2 = true;
              SetGlobalGenerator(this,gg);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) goto LAB_002beaf2;
        }
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) break;
      uVar10 = (ulong)(uVar9 + 1);
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5;
      bVar11 = uVar10 < uVar8;
    } while (uVar10 < uVar8);
    uVar10 = (ulong)local_b4;
  }
  if ((!bVar11) && ((uVar10 & 1) == 0)) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_b0,(SystemTools *)0x1,SUB81(uVar10,0));
    cmState::SetBinaryDirectory(this->State,&local_b0);
    collapse = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      collapse = extraout_DL_00;
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_b0,(SystemTools *)0x1,(bool)collapse);
    cmState::SetSourceDirectory(this->State,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args,
                    bool directoriesSetBefore)
{
  bool directoriesSet = directoriesSetBefore;
  bool haveToolset = false;
  bool havePlatform = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-H",0) == 0)
      {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
      }
    else if(arg.find("-S",0) == 0)
      {
      // There is no local generate anymore.  Ignore -S option.
      }
    else if(arg.find("-O",0) == 0)
      {
      // There is no local generate anymore.  Ignore -O option.
      }
    else if(arg.find("-B",0) == 0)
      {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
      }
    else if((i < args.size()-2) && (arg.find("--check-build-system",0) == 0))
      {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
      }
    else if((i < args.size()-1) && (arg.find("--check-stamp-file",0) == 0))
      {
      this->CheckStampFile = args[++i];
      }
    else if((i < args.size()-1) && (arg.find("--check-stamp-list",0) == 0))
      {
      this->CheckStampList = args[++i];
      }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if((i < args.size()-1) && (arg.find("--vs-solution-file",0) == 0))
      {
      this->VSSolutionFile = args[++i];
      }
#endif
    else if(arg.find("-V",0) == 0)
      {
        this->Verbose = true;
      }
    else if(arg.find("-D",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-U",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-C",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-P",0) == 0)
      {
      // skip for now
      i++;
      }
    else if(arg.find("--find-package",0) == 0)
      {
      // skip for now
      i++;
      }
    else if(arg.find("-Wno-dev",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-Wdev",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("--graphviz=",0) == 0)
      {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if ( this->GraphVizFile.empty() )
        {
        cmSystemTools::Error("No file specified for --graphviz");
        }
      }
    else if(arg.find("--debug-trycompile",0) == 0)
      {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
      }
    else if(arg.find("--debug-output",0) == 0)
      {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
      }
    else if(arg.find("--trace",0) == 0)
      {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      }
    else if(arg.find("--warn-uninitialized",0) == 0)
      {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
      }
    else if(arg.find("--warn-unused-vars",0) == 0)
      {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
      }
    else if(arg.find("--no-warn-unused-cli",0) == 0)
      {
      std::cout << "Not searching for unused variables given on the " <<
                   "command line.\n";
      this->SetWarnUnusedCli(false);
      }
    else if(arg.find("--check-system-vars",0) == 0)
      {
      std::cout << "Also check system files when warning about unused and " <<
                   "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
      }
    else if(arg.find("-A",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No platform specified for -A");
          return;
          }
        value = args[i];
        }
      if(havePlatform)
        {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
        }
      this->GeneratorPlatform = value;
      havePlatform = true;
      }
    else if(arg.find("-T",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No toolset specified for -T");
          return;
          }
        value = args[i];
        }
      if(haveToolset)
        {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
        }
      this->GeneratorToolset = value;
      haveToolset = true;
      }
    else if(arg.find("-G",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
          }
        value = args[i];
        }
      cmGlobalGenerator* gen =
        this->CreateGlobalGenerator(value);
      if(!gen)
        {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
        }
      else
        {
        this->SetGlobalGenerator(gen);
        }
      }
    // no option assume it is the path to the source
    else
      {
      directoriesSet = true;
      this->SetDirectoriesFromFile(arg.c_str());
      }
    }